

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nes_controller.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_499ae5::NesControllerTest_set_get_individual_Test::
~NesControllerTest_set_get_individual_Test(NesControllerTest_set_get_individual_Test *this)

{
  INesController *pIVar1;
  
  (this->super_NesControllerTest).super_Test._vptr_Test =
       (_func_int **)&PTR__NesControllerTest_002ae460;
  pIVar1 = (this->super_NesControllerTest).controller._M_t.
           super___uniq_ptr_impl<n_e_s::core::INesController,_std::default_delete<n_e_s::core::INesController>_>
           ._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::INesController_*,_std::default_delete<n_e_s::core::INesController>_>
           .super__Head_base<0UL,_n_e_s::core::INesController_*,_false>._M_head_impl;
  if (pIVar1 != (INesController *)0x0) {
    (*pIVar1->_vptr_INesController[1])();
  }
  (this->super_NesControllerTest).controller._M_t.
  super___uniq_ptr_impl<n_e_s::core::INesController,_std::default_delete<n_e_s::core::INesController>_>
  ._M_t.
  super__Tuple_impl<0UL,_n_e_s::core::INesController_*,_std::default_delete<n_e_s::core::INesController>_>
  .super__Head_base<0UL,_n_e_s::core::INesController_*,_false>._M_head_impl = (INesController *)0x0;
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(NesControllerTest, set_get_individual) {
    controller->set(INesController::Button::A, true);
    expect_buttons_pressed(
            true, false, false, false, false, false, false, false);
    controller->set(INesController::Button::B, true);
    expect_buttons_pressed(
            true, true, false, false, false, false, false, false);
    controller->set(INesController::Button::Select, true);
    expect_buttons_pressed(true, true, true, false, false, false, false, false);
    controller->set(INesController::Button::Start, true);
    expect_buttons_pressed(true, true, true, true, false, false, false, false);
    controller->set(INesController::Button::Up, true);
    expect_buttons_pressed(true, true, true, true, true, false, false, false);
    controller->set(INesController::Button::Down, true);
    expect_buttons_pressed(true, true, true, true, true, true, false, false);
    controller->set(INesController::Button::Left, true);
    expect_buttons_pressed(true, true, true, true, true, true, true, false);
    controller->set(INesController::Button::Right, true);
    expect_buttons_pressed(true, true, true, true, true, true, true, true);
    controller->set(INesController::Button::A, false);
    expect_buttons_pressed(false, true, true, true, true, true, true, true);
    controller->set(INesController::Button::B, false);
    expect_buttons_pressed(false, false, true, true, true, true, true, true);
    controller->set(INesController::Button::Select, false);
    expect_buttons_pressed(false, false, false, true, true, true, true, true);
    controller->set(INesController::Button::Start, false);
    expect_buttons_pressed(false, false, false, false, true, true, true, true);
    controller->set(INesController::Button::Up, false);
    expect_buttons_pressed(false, false, false, false, false, true, true, true);
    controller->set(INesController::Button::Down, false);
    expect_buttons_pressed(
            false, false, false, false, false, false, true, true);
    controller->set(INesController::Button::Left, false);
    expect_buttons_pressed(
            false, false, false, false, false, false, false, true);
    controller->set(INesController::Button::Right, false);
    expect_buttons_pressed(
            false, false, false, false, false, false, false, false);
}